

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathDivValues(xmlXPathParserContextPtr ctxt)

{
  xmlXPathObjectPtr pxVar1;
  int error;
  double dVar2;
  
  pxVar1 = valuePop(ctxt);
  if (pxVar1 == (xmlXPathObjectPtr)0x0) {
    error = 10;
  }
  else {
    dVar2 = xmlXPathCastToNumber(pxVar1);
    xmlXPathReleaseObject(ctxt->context,pxVar1);
    if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_NUMBER)) {
      xmlXPathNumberFunction(ctxt,1);
    }
    pxVar1 = ctxt->value;
    if ((pxVar1 != (xmlXPathObjectPtr)0x0) && (pxVar1->type == XPATH_NUMBER)) {
      pxVar1->floatval = pxVar1->floatval / dVar2;
      return;
    }
    error = 0xb;
  }
  xmlXPathErr(ctxt,error);
  return;
}

Assistant:

void
xmlXPathDivValues(xmlXPathParserContextPtr ctxt) {
    xmlXPathObjectPtr arg;
    double val;

    arg = valuePop(ctxt);
    if (arg == NULL)
	XP_ERROR(XPATH_INVALID_OPERAND);
    val = xmlXPathCastToNumber(arg);
    xmlXPathReleaseObject(ctxt->context, arg);
    CAST_TO_NUMBER;
    CHECK_TYPE(XPATH_NUMBER);
    ctxt->value->floatval /= val;
}